

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_maximal_dimension<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true>>>
               (Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>
                *m)

{
  Underlying_matrix *this;
  template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
  *this_00;
  Index IVar1;
  Pos_index PVar2;
  Index IVar3;
  iterator iVar4;
  pointer pIVar5;
  uint uVar6;
  Index IVar7;
  ulong uVar8;
  Pos_index index;
  uint uVar9;
  undefined4 local_148;
  int local_144;
  undefined1 *local_140;
  int *local_138;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
  *local_130;
  initializer_list<unsigned_int> local_128;
  undefined8 *local_118;
  undefined1 **local_110;
  undefined **local_100;
  undefined1 local_f8;
  undefined8 *local_f0;
  char *local_e8;
  undefined1 local_e0;
  undefined8 local_d8;
  shared_count sStack_d0;
  initializer_list<unsigned_int> local_c8;
  undefined8 *local_b8;
  int **local_b0;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x39f);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_00239238;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_144 = (m->matrix_).reducedMatrixR_.super_Matrix_dimension_option.maxDim_;
  local_138 = &local_144;
  local_148 = 2;
  local_e0 = local_144 == 2;
  local_d8 = 0;
  sStack_d0.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &local_138;
  local_c8._M_len = local_c8._M_len & 0xffffffffffffff00;
  local_c8._M_array = (iterator)&PTR__lazy_ostream_002391f8;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_128._M_len = local_128._M_len & 0xffffffffffffff00;
  local_110 = &local_140;
  local_128._M_array = (iterator)&PTR__lazy_ostream_002391f8;
  local_118 = &boost::unit_test::lazy_ostream::inst;
  local_140 = (undefined1 *)&local_148;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d0);
  local_c8._M_array = (iterator)0x100000000;
  local_c8._M_len = 0x300000002;
  local_b8 = (undefined8 *)0x500000004;
  local_128._M_len = 6;
  uVar9 = (m->matrix_).reducedMatrixR_.nextInsertIndex_;
  local_128._M_array = (iterator)&local_c8;
  if ((m->matrix_).reducedMatrixR_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>_>
    ::_orderRows(&(m->matrix_).reducedMatrixR_.
                  super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                );
  }
  this = &m->matrix_;
  local_130 = &(m->matrix_).reducedMatrixR_;
  this_00 = &(m->matrix_).reducedMatrixR_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
  ;
  uVar8 = (ulong)((long)*(pointer *)
                         ((long)&(m->matrix_).reducedMatrixR_.
                                 super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                                 .indexToRow_.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data + 8) -
                 (long)(m->matrix_).reducedMatrixR_.
                       super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                       .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 2;
  local_100 = (undefined **)CONCAT44(local_100._4_4_,(uint)uVar8);
  if ((uint)uVar8 <= uVar9) {
    do {
      iVar4._M_current =
           *(pointer *)
            ((long)&(m->matrix_).reducedMatrixR_.
                    super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                    .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data + 8);
      if (iVar4._M_current ==
          *(pointer *)
           ((long)&(m->matrix_).reducedMatrixR_.
                   super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                   .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar4,
                   (uint *)&local_100);
      }
      else {
        *iVar4._M_current = (uint)uVar8;
        *(uint **)((long)&(m->matrix_).reducedMatrixR_.
                          super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                          .indexToRow_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + 8) = iVar4._M_current + 1;
      }
      iVar4._M_current =
           *(pointer *)
            ((long)&(m->matrix_).reducedMatrixR_.
                    super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                    .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data + 8);
      if (iVar4._M_current ==
          *(pointer *)
           ((long)&(m->matrix_).reducedMatrixR_.
                   super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                   .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &(m->matrix_).reducedMatrixR_.
                    super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                    .rowToIndex_,iVar4,(uint *)&local_100);
      }
      else {
        *iVar4._M_current = (uint)local_100;
        *(uint **)((long)&(m->matrix_).reducedMatrixR_.
                          super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                          .rowToIndex_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + 8) = iVar4._M_current + 1;
      }
      uVar6 = (uint)local_100 + 1;
      uVar8 = (ulong)uVar6;
      local_100 = (undefined **)CONCAT44(local_100._4_4_,uVar6);
    } while (uVar6 <= uVar9);
  }
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true>>>
  ::_container_insert<std::initializer_list<unsigned_int>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true>>>
              *)local_130,&local_128,(m->matrix_).reducedMatrixR_.nextInsertIndex_,5);
  IVar1 = (m->matrix_).reducedMatrixR_.nextInsertIndex_;
  (m->matrix_).reducedMatrixR_.nextInsertIndex_ = IVar1 + 1;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
  ::_insert_boundary(this,IVar1);
  local_128._M_array = (iterator)0x100000000;
  local_128._M_len = 0x300000002;
  local_c8._M_len = 4;
  uVar9 = (m->matrix_).reducedMatrixR_.nextInsertIndex_;
  local_c8._M_array = (iterator)&local_128;
  if ((m->matrix_).reducedMatrixR_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>_>
    ::_orderRows(this_00);
  }
  uVar8 = (ulong)((long)*(pointer *)
                         ((long)&(m->matrix_).reducedMatrixR_.
                                 super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                                 .indexToRow_.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data + 8) -
                 (long)(m->matrix_).reducedMatrixR_.
                       super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                       .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 2;
  local_100 = (undefined **)CONCAT44(local_100._4_4_,(uint)uVar8);
  if ((uint)uVar8 <= uVar9) {
    do {
      iVar4._M_current =
           *(pointer *)
            ((long)&(m->matrix_).reducedMatrixR_.
                    super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                    .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data + 8);
      if (iVar4._M_current ==
          *(pointer *)
           ((long)&(m->matrix_).reducedMatrixR_.
                   super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                   .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar4,
                   (uint *)&local_100);
      }
      else {
        *iVar4._M_current = (uint)uVar8;
        *(uint **)((long)&(m->matrix_).reducedMatrixR_.
                          super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                          .indexToRow_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + 8) = iVar4._M_current + 1;
      }
      iVar4._M_current =
           *(pointer *)
            ((long)&(m->matrix_).reducedMatrixR_.
                    super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                    .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data + 8);
      if (iVar4._M_current ==
          *(pointer *)
           ((long)&(m->matrix_).reducedMatrixR_.
                   super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                   .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &(m->matrix_).reducedMatrixR_.
                    super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                    .rowToIndex_,iVar4,(uint *)&local_100);
      }
      else {
        *iVar4._M_current = (uint)local_100;
        *(uint **)((long)&(m->matrix_).reducedMatrixR_.
                          super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_false,_true,_true,_true>_>_>_>
                          .rowToIndex_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + 8) = iVar4._M_current + 1;
      }
      uVar6 = (uint)local_100 + 1;
      uVar8 = (ulong)uVar6;
      local_100 = (undefined **)CONCAT44(local_100._4_4_,uVar6);
    } while (uVar6 <= uVar9);
  }
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true>>>
  ::_container_insert<std::initializer_list<unsigned_int>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true>>>
              *)local_130,&local_c8,(m->matrix_).reducedMatrixR_.nextInsertIndex_,3);
  IVar1 = (m->matrix_).reducedMatrixR_.nextInsertIndex_;
  (m->matrix_).reducedMatrixR_.nextInsertIndex_ = IVar1 + 1;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
  ::_insert_boundary(this,IVar1);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x3a9);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_00239238;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_144 = (m->matrix_).reducedMatrixR_.super_Matrix_dimension_option.maxDim_;
  local_e0 = local_144 == 5;
  local_148 = 5;
  local_d8 = 0;
  sStack_d0.pi_ = (sp_counted_base *)0x0;
  local_c8._M_len = local_c8._M_len & 0xffffffffffffff00;
  local_128._M_len = local_128._M_len & 0xffffffffffffff00;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_138 = &local_144;
  local_c8._M_array = (iterator)&PTR__lazy_ostream_002391f8;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_138;
  local_128._M_array = (iterator)&PTR__lazy_ostream_002391f8;
  local_118 = &boost::unit_test::lazy_ostream::inst;
  local_110 = &local_140;
  local_140 = (undefined1 *)&local_148;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d0);
  uVar9 = (m->matrix_).nextEventIndex_ - 1;
  if (7 < uVar9) {
    index = 7;
    do {
      Gudhi::persistence_matrix::
      RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
      ::vine_swap(&this->super_RU_vine_swap_option,index);
      index = index + 1;
      PVar2 = (m->matrix_).nextEventIndex_;
      uVar9 = PVar2 - 1;
    } while (index < uVar9);
    if (PVar2 == 0) goto LAB_0015c378;
  }
  (m->matrix_).nextEventIndex_ = uVar9;
  Gudhi::persistence_matrix::
  RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
  ::_remove_last((RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
                  *)this,uVar9);
  IVar3 = (m->matrix_).mirrorMatrixU_.nextInsertIndex_;
  if (IVar3 != 0) {
    uVar9 = IVar3 - 1;
    (m->matrix_).mirrorMatrixU_.nextInsertIndex_ = uVar9;
    pIVar5 = (m->matrix_).mirrorMatrixU_.matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
    ::
    clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true>>>::Delete_disposer>
              ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                *)&pIVar5[uVar9].column_,pIVar5 + uVar9);
  }
  IVar7 = Gudhi::persistence_matrix::
          Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
          ::remove_last(local_130);
  if (IVar7 != 0xffffffff) {
    (m->matrix_).pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_start[IVar7] = 0xffffffff;
  }
LAB_0015c378:
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x3af);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_00239238;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_144 = (m->matrix_).reducedMatrixR_.super_Matrix_dimension_option.maxDim_;
  local_e0 = local_144 == 3;
  local_148 = 3;
  local_d8 = 0;
  sStack_d0.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_138 = &local_144;
  local_c8._M_len = local_c8._M_len & 0xffffffffffffff00;
  local_c8._M_array = (iterator)&PTR__lazy_ostream_002391f8;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_138;
  local_128._M_len = local_128._M_len & 0xffffffffffffff00;
  local_128._M_array = (iterator)&PTR__lazy_ostream_002391f8;
  local_118 = &boost::unit_test::lazy_ostream::inst;
  local_110 = &local_140;
  local_140 = (undefined1 *)&local_148;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d0);
  return;
}

Assistant:

void test_maximal_dimension(Matrix& m) {
  BOOST_CHECK_EQUAL(m.get_max_dimension(), 2);

  if constexpr (Matrix::Option_list::is_z2) {
    m.insert_boundary({0, 1, 2, 3, 4, 5});
    m.insert_boundary({0, 1, 2, 3});
  } else {
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}, {4, 1}, {5, 4}});
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}});
  }

  BOOST_CHECK_EQUAL(m.get_max_dimension(), 5);

  if constexpr (Matrix::Option_list::has_vine_update &&
                (Matrix::Option_list::is_of_boundary_type ||
                 (Matrix::Option_list::has_map_column_container && Matrix::Option_list::has_column_pairings))) {
    m.remove_maximal_cell(7);
    BOOST_CHECK_EQUAL(m.get_max_dimension(), 3);
  }
}